

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.hpp
# Opt level: O1

void __thiscall
Lib::Exception::
Exception<char_const*,char_const*,char_const*,std::__cxx11::string,char_const*,unsigned_int>
          (Exception *this,char *msg,char *msg_1,char *msg_2,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg_3,char *msg_4,
          uint msg_5)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (msg_3->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + msg_3->_M_string_length);
  toString<char_const*,char_const*,char_const*,std::__cxx11::string,char_const*,unsigned_int>
            (&local_50,this,msg,msg_1,msg_2,&local_70,msg_4,msg_5);
  this->_vptr_Exception = (_func_int **)&PTR_cry_00b69f40;
  (this->_message)._M_dataplus._M_p = (pointer)&(this->_message).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->_message,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

explicit Exception(Msg... msg)
   : Exception(toString(msg...))
  { }